

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntRemapArray(Vec_Int_t *vOld2New,Vec_Int_t *vOld,Vec_Int_t *vNew,int nNew)

{
  int iVar1;
  int iVar2;
  int local_28;
  int iNew;
  int iOld;
  int nNew_local;
  Vec_Int_t *vNew_local;
  Vec_Int_t *vOld_local;
  Vec_Int_t *vOld2New_local;
  
  iVar1 = Vec_IntSize(vOld);
  if (iVar1 != 0) {
    Vec_IntFill(vNew,nNew,0);
    for (local_28 = 0; iVar1 = Vec_IntSize(vOld2New), local_28 < iVar1; local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(vOld2New,local_28);
      if ((((0 < iVar1) && (iVar1 < nNew)) && (iVar2 = Vec_IntSize(vOld), local_28 < iVar2)) &&
         (iVar2 = Vec_IntEntry(vOld,local_28), iVar2 != 0)) {
        iVar2 = Vec_IntEntry(vOld,local_28);
        Vec_IntWriteEntry(vNew,iVar1,iVar2);
      }
    }
  }
  return;
}

Assistant:

static inline void Vec_IntRemapArray( Vec_Int_t * vOld2New, Vec_Int_t * vOld, Vec_Int_t * vNew, int nNew )
{
    int iOld, iNew;
    if ( Vec_IntSize(vOld) == 0 )
        return;
    Vec_IntFill( vNew, nNew, 0 );
    Vec_IntForEachEntry( vOld2New, iNew, iOld )
        if ( iNew > 0 && iNew < nNew && iOld < Vec_IntSize(vOld) && Vec_IntEntry(vOld, iOld) != 0 )
            Vec_IntWriteEntry( vNew, iNew, Vec_IntEntry(vOld, iOld) );
}